

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QByteArray *
QtStringBuilder::appendToByteArray<char_const(&)[22],QByteArray>
          (QByteArray *a,QStringBuilder<const_char_(&)[22],_QByteArray> *b,char param_3)

{
  long lVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  type *p;
  undefined1 in_DL;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *it;
  qsizetype len;
  char **in_stack_ffffffffffffff98;
  type *in_stack_ffffffffffffffa0;
  QArrayDataPointer<char> *in_stack_ffffffffffffffa8;
  QByteArray *this;
  undefined7 in_stack_ffffffffffffffc8;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QByteArray::size(in_RDI);
  qVar3 = QConcatenable<QStringBuilder<const_char_(&)[22],_QByteArray>_>::size
                    (in_stack_ffffffffffffffa0);
  local_10 = qVar2 + qVar3;
  QByteArray::detach((QByteArray *)in_stack_ffffffffffffffa0);
  lVar1 = local_10;
  QByteArray::data_ptr(in_RDI);
  qVar2 = QArrayDataPointer<char>::freeSpaceAtEnd(in_stack_ffffffffffffffa8);
  if (qVar2 < lVar1) {
    this = in_RDI;
    qVar2 = QByteArray::capacity((QByteArray *)0x33c966);
    local_18 = qVar2 << 1;
    qMax<long_long>(&local_10,&local_18);
    QByteArray::reserve(this,CONCAT17(in_DL,in_stack_ffffffffffffffc8));
  }
  p = (type *)QByteArray::data((QByteArray *)in_stack_ffffffffffffffa0);
  QByteArray::size(in_RDI);
  QConcatenable<QStringBuilder<const_char_(&)[22],_QByteArray>_>::appendTo<char>
            (p,in_stack_ffffffffffffff98);
  QByteArray::resize((longlong)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}